

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_script.cpp
# Opt level: O1

bool cfd::core::ContractHashUtil::CheckLiquidV1Watchman(Script *script)

{
  ScriptType SVar1;
  bool bVar2;
  ScriptOperator *pSVar3;
  int64_t iVar4;
  int64_t iVar5;
  ScriptElement element;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> list;
  IteratorWrapper<cfd::core::ScriptElement> ite;
  ScriptElement local_198;
  ScriptElement local_138;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_d8;
  IteratorWrapper<cfd::core::ScriptElement> local_c0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_68;
  string local_50;
  
  Script::GetElementList(&local_d8,script);
  if (local_d8.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_d8.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_138._vptr_ScriptElement = (_func_int **)0x5fc0b6;
    local_138.type_ = 0x3f;
    local_138.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
    logger::log<>((CfdSourceLocation *)&local_138,kCfdLogLevelWarning,"script empty.");
    bVar2 = false;
    goto LAB_004ac435;
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_68,&local_d8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Check LiquidV1 Watchman NG","");
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper(&local_c0,&local_68,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_68);
  IteratorWrapper<cfd::core::ScriptElement>::next(&local_138,&local_c0);
  pSVar3 = ScriptElement::GetOpCode(&local_138);
  bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_DEPTH);
  ScriptElement::~ScriptElement(&local_138);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    ScriptElement::ScriptElement(&local_138,0);
    IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
    SVar1 = local_198.op_code_.data_type_;
    if ((local_198.type_ == kElementNumber) || (local_198.value_ != 0)) {
      ScriptElement::~ScriptElement(&local_198);
LAB_004ac2dd:
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      pSVar3 = ScriptElement::GetOpCode(&local_198);
      bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_EQUAL);
      ScriptElement::~ScriptElement(&local_198);
      if (bVar2) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x50;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      pSVar3 = ScriptElement::GetOpCode(&local_198);
      bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_IF);
      ScriptElement::~ScriptElement(&local_198);
      if (bVar2) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x55;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      ScriptElement::operator=(&local_138,&local_198);
      ScriptElement::~ScriptElement(&local_198);
      if ((local_138.type_ != kElementOpCode) ||
         ((local_138.value_ == 0 && (local_138.op_code_.data_type_ != kOpFalse)))) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x5b;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      iVar4 = ScriptElement::GetNumber(&local_138);
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      ScriptElement::operator=(&local_138,&local_198);
      ScriptElement::~ScriptElement(&local_198);
      while( true ) {
        pSVar3 = ScriptElement::GetOpCode(&local_138);
        bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_ELSE);
        if (!bVar2) break;
        if (kElementBinary < local_138.type_) {
          local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
          local_198.type_ = 100;
          local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
          logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                        "LiquidV1 watchman script fail.");
          goto LAB_004ac41c;
        }
        IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
        ScriptElement::operator=(&local_138,&local_198);
        ScriptElement::~ScriptElement(&local_198);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      if ((local_198.type_ == kElementNumber) || (local_198.value_ != 0)) {
        ScriptElement::~ScriptElement(&local_198);
      }
      else {
        ScriptElement::~ScriptElement(&local_198);
        if (local_198.op_code_.data_type_ != kOpFalse) {
          local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
          local_198.type_ = 0x6b;
          local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
          logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                        "LiquidV1 watchman script fail.");
          goto LAB_004ac41c;
        }
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      pSVar3 = ScriptElement::GetOpCode(&local_198);
      bVar2 = ScriptOperator::operator!=
                        (pSVar3,(ScriptOperator *)ScriptOperator::OP_CHECKSEQUENCEVERIFY);
      ScriptElement::~ScriptElement(&local_198);
      if (bVar2) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x6f;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      pSVar3 = ScriptElement::GetOpCode(&local_198);
      bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_DROP);
      ScriptElement::~ScriptElement(&local_198);
      if (bVar2) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x73;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      ScriptElement::operator=(&local_138,&local_198);
      ScriptElement::~ScriptElement(&local_198);
      if ((local_138.type_ != kElementOpCode) ||
         ((local_138.value_ == 0 && (local_138.op_code_.data_type_ != kOpFalse)))) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x78;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      iVar5 = ScriptElement::GetNumber(&local_138);
      if (iVar4 == iVar5) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x7e;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      ScriptElement::operator=(&local_138,&local_198);
      ScriptElement::~ScriptElement(&local_198);
      while( true ) {
        pSVar3 = ScriptElement::GetOpCode(&local_138);
        bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_ENDIF);
        if (!bVar2) break;
        if (kElementBinary < local_138.type_) {
          local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
          local_198.type_ = 0x85;
          local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
          logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                        "LiquidV1 watchman script fail.");
          goto LAB_004ac41c;
        }
        IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
        ScriptElement::operator=(&local_138,&local_198);
        ScriptElement::~ScriptElement(&local_198);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next(&local_198,&local_c0);
      pSVar3 = ScriptElement::GetOpCode(&local_198);
      bVar2 = ScriptOperator::operator!=(pSVar3,(ScriptOperator *)ScriptOperator::OP_CHECKMULTISIG);
      ScriptElement::~ScriptElement(&local_198);
      if (bVar2) {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x8c;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      if ((&local_c0.iterator_)[local_c0.reverse_]._M_current !=
          *(ScriptElement **)
           ((long)&local_c0.vector_.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + (ulong)(local_c0.reverse_ ^ 1) * 8))
      {
        local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
        local_198.type_ = 0x90;
        local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
        logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                      "LiquidV1 watchman script fail.");
        goto LAB_004ac41c;
      }
      bVar2 = true;
    }
    else {
      ScriptElement::~ScriptElement(&local_198);
      if (SVar1 == kOpFalse) goto LAB_004ac2dd;
      local_198._vptr_ScriptElement = (_func_int **)0x5fc0b6;
      local_198.type_ = 0x4c;
      local_198.op_code_._vptr_ScriptOperator = (_func_int **)0x5fc0d2;
      logger::log<>((CfdSourceLocation *)&local_198,kCfdLogLevelWarning,
                    "LiquidV1 watchman script fail.");
LAB_004ac41c:
      bVar2 = false;
    }
    ScriptElement::~ScriptElement(&local_138);
  }
  IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper(&local_c0);
LAB_004ac435:
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_d8);
  return bVar2;
}

Assistant:

bool ContractHashUtil::CheckLiquidV1Watchman(const Script& script) {
  try {
    std::vector<ScriptElement> list = script.GetElementList();
    if (list.empty()) {
      warn(CFD_LOG_SOURCE, "script empty.");
      return false;
    }

    IteratorWrapper<ScriptElement> ite(list, "Check LiquidV1 Watchman NG");
    if (ite.next().GetOpCode() != ScriptOperator::OP_DEPTH) {
      // warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      // Does not log if it is different from the beginning of the script
      return false;
    }

    ScriptElement element(0);
    if (!ite.next().IsNumber()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_EQUAL) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    if (ite.next().GetOpCode() != ScriptOperator::OP_IF) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    element = ite.next();
    if (!(element.IsOpCode() && element.IsNumber())) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    int64_t req_num = element.GetNumber();

    // check pubkey
    element = ite.next();
    while (element.GetOpCode() != ScriptOperator::OP_ELSE) {
      if ((!element.IsOpCode()) && (!element.IsBinary())) {
        warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
        return false;
      }
      element = ite.next();
    }

    if (!ite.next().IsNumber()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_CHECKSEQUENCEVERIFY) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.next().GetOpCode() != ScriptOperator::OP_DROP) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    element = ite.next();
    if (!(element.IsOpCode() && element.IsNumber())) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    int64_t req_num2 = element.GetNumber();

    if (req_num == req_num2) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }

    element = ite.next();
    while (element.GetOpCode() != ScriptOperator::OP_ENDIF) {
      if ((!element.IsOpCode()) && (!element.IsBinary())) {
        warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
        return false;
      }
      element = ite.next();
    }

    if (ite.next().GetOpCode() != ScriptOperator::OP_CHECKMULTISIG) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    if (ite.hasNext()) {
      warn(CFD_LOG_SOURCE, "LiquidV1 watchman script fail.");
      return false;
    }
    return true;
  } catch (...) {
    warn(CFD_LOG_SOURCE, "Check LiquidV1 Watchman exception.");
    return false;
  }
}